

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

bool __thiscall MeCab::anon_unknown_0::ModelImpl::swap(ModelImpl *this,Model *model)

{
  char *str;
  
  str = "atomic model replacement is not supported";
  if ((this->writer_).ptr_ == (Writer *)0x0) {
    str = "current model is not available";
  }
  if (this->viterbi_ == (Viterbi *)0x0) {
    str = "current model is not available";
  }
  setGlobalError(str);
  if (model != (Model *)0x0) {
    (*model->_vptr_Model[7])(model);
  }
  return false;
}

Assistant:

bool ModelImpl::swap(Model *model) {
  scoped_ptr<Model> model_data(model);

  if (!is_available()) {
    setGlobalError("current model is not available");
    return false;
  }
#ifndef HAVE_ATOMIC_OPS
  setGlobalError("atomic model replacement is not supported");
  return false;
#else
  ModelImpl *m = static_cast<ModelImpl *>(model_data.get());
  if (!m) {
    setGlobalError("Invalid model is passed");
    return false;
  }

  if (!m->is_available()) {
    setGlobalError("Passed model is not available");
    return false;
  }

  Viterbi *current_viterbi = viterbi_;
  {
    scoped_writer_lock l(mutex());
    viterbi_      = m->take_viterbi();
    request_type_ = m->request_type();
    theta_        = m->theta();
  }

  delete current_viterbi;

  return true;
#endif
}